

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O1

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint
          (DebugDocument *this,StatementLocation statement,BREAKPOINT_STATE bps)

{
  ScriptContext *this_00;
  DebugManager *pDVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ArenaAllocator *alloc;
  BreakpointProbe *pBVar5;
  DebugContext *pDVar6;
  BreakpointProbeList *pBVar7;
  undefined4 *puVar8;
  List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  UINT breakpointId;
  long lVar9;
  undefined1 local_b8 [8];
  ArenaAllocator arena;
  
  this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
  if ((this_00 != (ScriptContext *)0x0) &&
     (iVar4 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00),
     (char)iVar4 == '\0')) {
    if (BREAKPOINT_DISABLED < bps) {
      if (bps == BREAKPOINT_ENABLED) {
        alloc = ScriptContext::AllocatorForDiagnostics(this_00);
        pBVar5 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
        pDVar1 = this_00->threadContext->debugManager;
        breakpointId = pDVar1->nextBreakPointId + 1;
        pDVar1->nextBreakPointId = breakpointId;
        BreakpointProbe::BreakpointProbe(pBVar5,this,&statement,breakpointId);
        pDVar6 = ScriptContext::GetDebugContext(this_00);
        ProbeContainer::AddProbe(pDVar6->diagProbesContainer,(Probe *)pBVar5);
        pBVar7 = GetBreakpointList(this);
        JsUtil::
        List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pBVar7,0);
        iVar4 = (pBVar7->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                count;
        (pBVar7->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>)
        .buffer[iVar4] = pBVar5;
        (pBVar7->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>)
        .count = iVar4 + 1;
        return pBVar5;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                  ,0x65,"(0)","Bad breakpoint state");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pBVar7 = GetBreakpointList(this);
    if (pBVar7 != (BreakpointProbeList *)0x0) {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_b8,
                 L"TemporaryBreakpointList",
                 &this_00->threadContext->debugManager->diagnosticPageAllocator,Throw::OutOfMemory,
                 JsUtil::ExternalApi::RecoverUnusedMemory);
      this_01 = (List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)local_b8,0x366bee);
      (this_01->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      buffer = (Type)0x0;
      (this_01->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count = 0;
      (this_01->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      alloc = (Type)local_b8;
      (this_01->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f7780;
      this_01->length = 0;
      this_01->increment = 4;
      if (0 < (pBVar7->
              super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count) {
        lVar9 = 0;
        do {
          pBVar5 = (pBVar7->
                   super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                   ).buffer[lVar9];
          bVar3 = BreakpointProbe::Matches(pBVar5,statement.function,statement.statement.begin);
          if (bVar3) {
            pDVar6 = ScriptContext::GetDebugContext(this_00);
            ProbeContainer::RemoveProbe(pDVar6->diagProbesContainer,&pBVar5->super_Probe);
            JsUtil::
            List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_01,0);
            iVar4 = (this_01->
                    super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (this_01->
            super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer[iVar4] = pBVar5;
            (this_01->
            super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count = iVar4 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < (pBVar7->
                         super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                         ).count);
      }
      if (0 < (this_01->
              super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count) {
        lVar9 = 0;
        do {
          arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
               (this_01->
               super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
               buffer[lVar9];
          CopyRemovePolicy<JsUtil::List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
          ::Remove((CopyRemovePolicy<JsUtil::List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                    *)&pBVar7->field_0x28,pBVar7,
                   (TElementType *)
                   &arena.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    freeList);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this_01->
                         super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>
                         ).count);
      }
      (this_01->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count = 0;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
      ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          local_b8);
    }
  }
  return (BreakpointProbe *)0x0;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint(StatementLocation statement, BREAKPOINT_STATE bps)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();

        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        switch (bps)
        {
            default:
                AssertMsg(FALSE, "Bad breakpoint state");
                // Fall thru
            case BREAKPOINT_DISABLED:
            case BREAKPOINT_DELETED:
            {
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                if (pBreakpointList)
                {
                    ArenaAllocator arena(_u("TemporaryBreakpointList"), scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
                    BreakpointProbeList* pDeleteList = this->NewBreakpointList(&arena);

                    pBreakpointList->Map([&statement, scriptContext, pDeleteList](int index, BreakpointProbe * breakpointProbe)
                    {
                        if (breakpointProbe->Matches(statement.function, statement.statement.begin))
                        {
                            scriptContext->GetDebugContext()->GetProbeContainer()->RemoveProbe(breakpointProbe);
                            pDeleteList->Add(breakpointProbe);
                        }
                    });

                    pDeleteList->Map([pBreakpointList](int index, BreakpointProbe * breakpointProbe)
                    {
                        pBreakpointList->Remove(breakpointProbe);
                    });
                    pDeleteList->Clear();
                }

                break;
            }
            case BREAKPOINT_ENABLED:
            {
                BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement,
                    scriptContext->GetThreadContext()->GetDebugManager()->GetNextBreakpointId());

                scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
                BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
                pBreakpointList->Add(pProbe);
                return pProbe;
                break;
            }
        }
        return nullptr;
    }